

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubD_ComponentIdTypeAndTag
ON_SubD_ComponentIdTypeAndTag::FindFromTypeAndId
          (Type type,uint id,ON_SimpleArray<ON_SubD_ComponentIdTypeAndTag> *sorted_tags)

{
  uint uVar1;
  ON_SubD_ComponentIdTypeAndTag *pOVar2;
  undefined7 in_register_00000039;
  ON_SubD_ComponentIdTypeAndTag itt;
  ON_SubD_ComponentIdTypeAndTag local_18;
  
  if ((int)CONCAT71(in_register_00000039,type) == 0 || id == 0) {
    return (ON_SubD_ComponentIdTypeAndTag)ZEXT816((ulong)(float  [2])0x0);
  }
  local_18.m_sharpness = (ON_SubDEdgeSharpness)(float  [2])0x0;
  local_18.m_type = type;
  local_18.m_id = id;
  local_18._13_3_ = 0;
  uVar1 = ON_SimpleArray<ON_SubD_ComponentIdTypeAndTag>::BinarySearch
                    (sorted_tags,&local_18,CompareTypeAndId);
  if ((int)uVar1 < 0) {
    pOVar2 = &Unset;
  }
  else {
    pOVar2 = (ON_SubD_ComponentIdTypeAndTag *)((ulong)uVar1 * 0x10 + *(long *)(sorted_tags + 8));
  }
  return *pOVar2;
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::FindFromTypeAndId(ON_SubDComponentPtr::Type type, unsigned id, const ON_SimpleArray< ON_SubD_ComponentIdTypeAndTag>& sorted_tags)
{
  if (0 == id || ON_SubDComponentPtr::Type::Unset == type)
    return ON_SubD_ComponentIdTypeAndTag::Unset;
  ON_SubD_ComponentIdTypeAndTag itt;
  itt.m_id = id;
  itt.m_type = type;
  const int i = sorted_tags.BinarySearch(&itt, ON_SubD_ComponentIdTypeAndTag::CompareTypeAndId);
  return (i >= 0) ? sorted_tags[i] : ON_SubD_ComponentIdTypeAndTag::Unset;
}